

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

sample * nonius::detail::
         resample<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double(*const)(__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>)>
                   (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                    *rng,int resamples,
                   __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> first,
                   __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> last,
                   _func_double___normal_iterator<double_ptr,_std::vector<double,_std::allocator<double>_>_>___normal_iterator<double_ptr,_std::vector<double,_std::allocator<double>_>_>
                   **estimator)

{
  anon_class_40_5_f2dc1741 __gen;
  back_insert_iterator<std::vector<double,_std::allocator<double>_>_> bVar1;
  undefined8 in_RCX;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_RDI;
  vector<double,_std::allocator<double>_> *in_R9;
  uniform_int_distribution<long> dist;
  difference_type n;
  sample *out;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff08;
  vector<double,_std::allocator<double>_> *this;
  uniform_int_distribution<long> *in_stack_ffffffffffffff10;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first;
  undefined8 in_stack_ffffffffffffff30;
  size_type in_stack_ffffffffffffff38;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff40;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *pmVar2;
  double local_48 [2];
  vector<double,_std::allocator<double>_> *local_38;
  back_insert_iterator<std::vector<double,_std::allocator<double>_>_> local_30;
  int iStack_c;
  
  iStack_c = (int)((ulong)in_RCX >> 0x20);
  pmVar2 = in_RDI;
  local_30.container = in_R9;
  local_38 = (vector<double,_std::allocator<double>_> *)
             __gnu_cxx::operator-
                       ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                         *)in_stack_ffffffffffffff10,
                        (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                         *)in_stack_ffffffffffffff08);
  std::uniform_int_distribution<long>::uniform_int_distribution
            (in_stack_ffffffffffffff10,(long)in_stack_ffffffffffffff08,0x25294c);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x25295e);
  std::vector<double,_std::allocator<double>_>::reserve
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  bVar1 = std::back_inserter<std::vector<double,std::allocator<double>>>(in_stack_ffffffffffffff08);
  __first._M_current = local_48;
  __gen.first._M_current = (double *)in_stack_ffffffffffffff38;
  __gen.n = in_stack_ffffffffffffff30;
  __gen.estimator =
       (_func_double___normal_iterator<double_ptr,_std::vector<double,_std::allocator<double>_>_>___normal_iterator<double_ptr,_std::vector<double,_std::allocator<double>_>_>
        **)bVar1.container;
  __gen.dist = (uniform_int_distribution<long> *)in_RDI;
  __gen.rng = pmVar2;
  this = local_38;
  std::
  generate_n<std::back_insert_iterator<std::vector<double,std::allocator<double>>>,int,nonius::detail::resample<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double(*const)(__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>)>(std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&,int,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double(*const&)(__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>))::_lambda()_1_>
            (local_30,iStack_c,__gen);
  std::vector<double,_std::allocator<double>_>::begin(this);
  std::vector<double,_std::allocator<double>_>::end(this);
  std::sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            (__first,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     local_30.container);
  return (sample *)in_RDI;
}

Assistant:

sample resample(URng& rng, int resamples, Iterator first, Iterator last, Estimator& estimator) {
            auto n = last - first;
            std::uniform_int_distribution<decltype(n)> dist(0, n-1);

            sample out;
            out.reserve(resamples);
            std::generate_n(std::back_inserter(out), resamples, [n, first, &estimator, &dist, &rng] {
                std::vector<double> resampled;
                resampled.reserve(n);
                std::generate_n(std::back_inserter(resampled), n, [first, &dist, &rng] { return first[dist(rng)]; });
                return estimator(resampled.begin(), resampled.end());
            });
            std::sort(out.begin(), out.end());
            return out;
        }